

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Detonation_PDU::Detonation_PDU
          (Detonation_PDU *this,Warfare_Header *WarfareHeader,Vector *Velocity,
          WorldCoordinates *LocationWorldCoords,DescPtr *Desc,Vector *LocationEntityCoords,
          DetonationResult DetonationResult)

{
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> local_60;
  Vector *local_38;
  Vector *LocationEntityCoords_local;
  DescPtr *Desc_local;
  WorldCoordinates *LocationWorldCoords_local;
  Vector *Velocity_local;
  Warfare_Header *WarfareHeader_local;
  Detonation_PDU *this_local;
  
  local_38 = LocationEntityCoords;
  LocationEntityCoords_local = (Vector *)Desc;
  Desc_local = (DescPtr *)LocationWorldCoords;
  LocationWorldCoords_local = (WorldCoordinates *)Velocity;
  Velocity_local = (Vector *)WarfareHeader;
  WarfareHeader_local = &this->super_Warfare_Header;
  Warfare_Header::Warfare_Header(&this->super_Warfare_Header,WarfareHeader);
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Detonation_PDU_0032f470;
  DATA_TYPE::Vector::Vector(&this->m_Velocity,(Vector *)LocationWorldCoords_local);
  DATA_TYPE::WorldCoordinates::WorldCoordinates
            (&this->m_LocationWorldCoords,(WorldCoordinates *)Desc_local);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&this->m_pDescriptor);
  DATA_TYPE::Vector::Vector(&this->m_LocationEntityCoords,local_38);
  this->m_ui8DetonationResult = (undefined1)DetonationResult;
  this->m_ui8NumOfVariableParams = '\0';
  this->m_ui16Padding1 = 0;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ::vector(&this->m_vVariableParameters);
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8PDUType = '\x03';
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength = 0x68;
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&local_60,Desc);
  SetDescriptor(this,&local_60);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr(&local_60);
  return;
}

Assistant:

Detonation_PDU::Detonation_PDU( const Warfare_Header & WarfareHeader, const Vector & Velocity,
                                const WorldCoordinates & LocationWorldCoords, DescPtr Desc,
                                const Vector & LocationEntityCoords, DetonationResult DetonationResult ) :
    Warfare_Header( WarfareHeader ),
    m_Velocity( Velocity ),
    m_LocationWorldCoords( LocationWorldCoords ),
    m_LocationEntityCoords( LocationEntityCoords ),
    m_ui8DetonationResult( DetonationResult ),
    m_ui8NumOfVariableParams( 0 ),
    m_ui16Padding1( 0 )
{
    m_ui8PDUType = Detonation_PDU_Type;
    m_ui16PDULength = DETONATION_PDU_SIZE;
    SetDescriptor( Desc );
}